

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_set_var_nentry_test(btree_kv_ops *kv_ops)

{
  uint8_t uVar1;
  int iVar2;
  bnode *__ptr;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  char *__format;
  long lVar6;
  uint8_t v;
  btree_kv_ops *local_50;
  char local_48 [8];
  timeval __test_begin;
  
  local_50 = kv_ops;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = dummy_node('\b','\x01',1);
  __ptr->nentry = 10;
  v = 'd';
  uVar5 = 0;
  lVar6 = 0;
  do {
    if ((int)lVar6 == 0x5a) {
      free(__ptr);
      memleak_end();
      __format = "%s PASSED\n";
      if (kv_set_var_nentry_test(btree_kv_ops*)::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"kv_set_var_nentry_test");
      return;
    }
    sprintf(local_48,"key%d",uVar5);
    (*local_50->set_kv)(__ptr,(idx_t)uVar5,local_48,&v);
    pvVar4 = (__ptr->field_4).data;
    sVar3 = strlen(local_48);
    iVar2 = bcmp((void *)((long)pvVar4 + lVar6),local_48,sVar3);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0x9d);
      kv_set_var_nentry_test(btree_kv_ops*)::__test_pass = '\x01';
      pvVar4 = (__ptr->field_4).data;
      sVar3 = strlen(local_48);
      iVar2 = bcmp((void *)((long)pvVar4 + lVar6),local_48,sVar3);
      if (iVar2 != 0) {
        __assert_fail("!memcmp((uint8_t *)node->data + offset, key, strlen(key))",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x9d,"void kv_set_var_nentry_test(btree_kv_ops *)");
      }
    }
    uVar1 = *(uint8_t *)((long)pvVar4 + lVar6 + 8);
    if (uVar1 != v) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0x9f);
      kv_set_var_nentry_test(btree_kv_ops*)::__test_pass = '\x01';
      uVar1 = *(uint8_t *)((__ptr->field_4).dummy + 8 + lVar6);
      if (uVar1 != v) {
        __assert_fail("!memcmp((uint8_t *)node->data + offset, &v, vsize)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x9f,"void kv_set_var_nentry_test(btree_kv_ops *)");
      }
    }
    lVar6 = lVar6 + 9;
    v = uVar1 + '\x01';
    uVar5 = (ulong)((int)uVar5 + 1);
  } while( true );
}

Assistant:

void kv_set_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v;
    idx_t idx;
    int n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    size_t offset = 0;
    char *key = alca(char, ksize);


    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    for (idx = 0; idx < n; idx ++){

        // set key/value
        sprintf(key, "key%d", idx);
        kv_ops->set_kv(node, idx, key, (void *)&v);

        // verify
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key, strlen(key)));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;

        // update value
        v++;

    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_test");
}